

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_prov.c
# Opt level: O0

int ossl_prov_bio_from_dispatch(OSSL_DISPATCH *fns)

{
  OSSL_DISPATCH *in_RDI;
  OSSL_DISPATCH *local_8;
  
  for (local_8 = in_RDI; local_8->function_id != 0; local_8 = local_8 + 1) {
    switch(local_8->function_id) {
    case 0x28:
      if (c_bio_new_file == (OSSL_FUNC_BIO_new_file_fn *)0x0) {
        c_bio_new_file = OSSL_FUNC_BIO_new_file(local_8);
      }
      break;
    case 0x29:
      if (c_bio_new_membuf == (OSSL_FUNC_BIO_new_membuf_fn *)0x0) {
        c_bio_new_membuf = OSSL_FUNC_BIO_new_membuf(local_8);
      }
      break;
    case 0x2a:
      if (c_bio_read_ex == (OSSL_FUNC_BIO_read_ex_fn *)0x0) {
        c_bio_read_ex = OSSL_FUNC_BIO_read_ex(local_8);
      }
      break;
    case 0x2b:
      if (c_bio_write_ex == (OSSL_FUNC_BIO_write_ex_fn *)0x0) {
        c_bio_write_ex = OSSL_FUNC_BIO_write_ex(local_8);
      }
      break;
    case 0x2c:
      if (c_bio_up_ref == (undefined1 *)0x0) {
        c_bio_up_ref = OSSL_FUNC_BIO_up_ref(local_8);
      }
      break;
    case 0x2d:
      if (c_bio_free == (undefined1 *)0x0) {
        c_bio_free = OSSL_FUNC_BIO_free(local_8);
      }
      break;
    case 0x2e:
      if (c_bio_vprintf == (OSSL_FUNC_BIO_vprintf_fn *)0x0) {
        c_bio_vprintf = OSSL_FUNC_BIO_vprintf(local_8);
      }
      break;
    case 0x30:
      if (c_bio_puts == (OSSL_FUNC_BIO_puts_fn *)0x0) {
        c_bio_puts = OSSL_FUNC_BIO_puts(local_8);
      }
      break;
    case 0x31:
      if (c_bio_gets == (OSSL_FUNC_BIO_gets_fn *)0x0) {
        c_bio_gets = OSSL_FUNC_BIO_gets(local_8);
      }
      break;
    case 0x32:
      if (c_bio_ctrl == (OSSL_FUNC_BIO_ctrl_fn *)0x0) {
        c_bio_ctrl = OSSL_FUNC_BIO_ctrl(local_8);
      }
    }
  }
  return 1;
}

Assistant:

int ossl_prov_bio_from_dispatch(const OSSL_DISPATCH *fns)
{
    for (; fns->function_id != 0; fns++) {
        switch (fns->function_id) {
        case OSSL_FUNC_BIO_NEW_FILE:
            if (c_bio_new_file == NULL)
                c_bio_new_file = OSSL_FUNC_BIO_new_file(fns);
            break;
        case OSSL_FUNC_BIO_NEW_MEMBUF:
            if (c_bio_new_membuf == NULL)
                c_bio_new_membuf = OSSL_FUNC_BIO_new_membuf(fns);
            break;
        case OSSL_FUNC_BIO_READ_EX:
            if (c_bio_read_ex == NULL)
                c_bio_read_ex = OSSL_FUNC_BIO_read_ex(fns);
            break;
        case OSSL_FUNC_BIO_WRITE_EX:
            if (c_bio_write_ex == NULL)
                c_bio_write_ex = OSSL_FUNC_BIO_write_ex(fns);
            break;
        case OSSL_FUNC_BIO_GETS:
            if (c_bio_gets == NULL)
                c_bio_gets = OSSL_FUNC_BIO_gets(fns);
            break;
        case OSSL_FUNC_BIO_PUTS:
            if (c_bio_puts == NULL)
                c_bio_puts = OSSL_FUNC_BIO_puts(fns);
            break;
        case OSSL_FUNC_BIO_CTRL:
            if (c_bio_ctrl == NULL)
                c_bio_ctrl = OSSL_FUNC_BIO_ctrl(fns);
            break;
        case OSSL_FUNC_BIO_UP_REF:
            if (c_bio_up_ref == NULL)
                c_bio_up_ref = OSSL_FUNC_BIO_up_ref(fns);
            break;
        case OSSL_FUNC_BIO_FREE:
            if (c_bio_free == NULL)
                c_bio_free = OSSL_FUNC_BIO_free(fns);
            break;
        case OSSL_FUNC_BIO_VPRINTF:
            if (c_bio_vprintf == NULL)
                c_bio_vprintf = OSSL_FUNC_BIO_vprintf(fns);
            break;
        }
    }

    return 1;
}